

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

int __thiscall leveldb::VersionSet::NumLevelFiles(VersionSet *this,int level)

{
  if (level < 0) {
    __assert_fail("level >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                  ,0x45c,"int leveldb::VersionSet::NumLevelFiles(int) const");
  }
  if ((uint)level < 7) {
    return (int)((ulong)((long)this->current_->files_[(uint)level].
                               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)this->current_->files_[(uint)level].
                              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  __assert_fail("level < config::kNumLevels",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                ,0x45d,"int leveldb::VersionSet::NumLevelFiles(int) const");
}

Assistant:

int VersionSet::NumLevelFiles(int level) const {
  assert(level >= 0);
  assert(level < config::kNumLevels);
  return current_->files_[level].size();
}